

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

uint8_t icu_63::getCharCat(UChar32 cp)

{
  uint8_t local_11;
  uint8_t cat;
  UChar32 cp_local;
  
  if ((cp < 0xfdd0) || (((0xfdef < cp && ((cp & 0xfffeU) != 0xfffe)) || (0x10ffff < cp)))) {
    local_11 = u_charType_63(cp);
    if ((local_11 == '\x12') && (local_11 = ' ', (cp & 0xfffffc00U) == 0xd800)) {
      local_11 = '\x1f';
    }
    cat = local_11;
  }
  else {
    cat = '\x1e';
  }
  return cat;
}

Assistant:

static uint8_t getCharCat(UChar32 cp) {
    uint8_t cat;

    if (U_IS_UNICODE_NONCHAR(cp)) {
        return U_NONCHARACTER_CODE_POINT;
    }

    if ((cat = u_charType(cp)) == U_SURROGATE) {
        cat = U_IS_LEAD(cp) ? U_LEAD_SURROGATE : U_TRAIL_SURROGATE;
    }

    return cat;
}